

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O1

int __thiscall ncnn::YoloDetectionOutput::create_pipeline(YoloDetectionOutput *this,Option *opt)

{
  Layer *pLVar1;
  ParamDict pd;
  ParamDict PStack_28;
  
  pLVar1 = create_layer(0x20);
  this->softmax = pLVar1;
  ParamDict::ParamDict(&PStack_28);
  ParamDict::set(&PStack_28,0,0);
  (*this->softmax->_vptr_Layer[2])(this->softmax,&PStack_28);
  (*this->softmax->_vptr_Layer[4])(this->softmax,opt);
  ParamDict::~ParamDict(&PStack_28);
  return 0;
}

Assistant:

int YoloDetectionOutput::create_pipeline(const Option& opt)
{
    {
        softmax = ncnn::create_layer(ncnn::LayerType::Softmax);

        ncnn::ParamDict pd;
        pd.set(0, 0); // axis

        softmax->load_param(pd);

        softmax->create_pipeline(opt);
    }

    return 0;
}